

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::CUnescape(string_view source,Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  bool bVar1;
  Nullable<std::string_*> in_RDX;
  undefined8 in_RSI;
  Nonnull<std::string_*> in_RDI;
  string_view in_stack_00000000;
  
  bVar1 = anon_unknown_0::CUnescapeInternal
                    (in_stack_00000000,SUB81((ulong)in_RSI >> 0x38,0),in_RDI,in_RDX);
  return bVar1;
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}